

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# blake2.c
# Opt level: O0

void blake2b_final(blake2b_state *S,void *out,size_t outlen)

{
  uint local_6c;
  undefined1 local_68 [4];
  uint i;
  uint8_t buffer [64];
  size_t outlen_local;
  void *out_local;
  blake2b_state *S_local;
  
  memset(local_68,0,0x40);
  blake2b_increment_counter(S,S->buflen);
  memset(S->buf + S->buflen,0,0x80 - S->buflen);
  blake2b_compress(S,S->buf,0xffffffffffffffff);
  for (local_6c = 0; local_6c < 8; local_6c = local_6c + 1) {
    store64(local_68 + (ulong)local_6c * 8,S->h[local_6c]);
  }
  memcpy(out,local_68,outlen);
  clear_internal_memory(local_68,0x40);
  clear_internal_memory(S->buf,0x80);
  clear_internal_memory(S,0x40);
  return;
}

Assistant:

void blake2b_final(blake2b_state *S, void *out, size_t outlen)
{
    uint8_t buffer[BLAKE2B_OUTBYTES] = {0};
    unsigned int i;

    blake2b_increment_counter(S, S->buflen);
    memset(&S->buf[S->buflen], 0, BLAKE2B_BLOCKBYTES - S->buflen); /* Padding */
    blake2b_compress(S, S->buf, UINT64_C(0xFFFFFFFFFFFFFFFF));

    for (i = 0; i < 8; ++i) { /* Output full hash to temp buffer */
        store64(buffer + i * sizeof(uint64_t), S->h[i]);
    }

    memcpy(out, buffer, outlen);
    clear_internal_memory(buffer, sizeof(buffer));
    clear_internal_memory(S->buf, sizeof(S->buf));
    clear_internal_memory(S->h, sizeof(S->h));
}